

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O0

FloatTexture __thiscall
pbrt::TextureParameterDictionary::GetFloatTextureOrNull
          (TextureParameterDictionary *this,string *name,Allocator alloc)

{
  bool bVar1;
  FileLoc *loc;
  FileLoc *fmt;
  size_t sVar2;
  const_iterator args_1;
  undefined8 *in_RSI;
  TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatDirectionMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::GPUFloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
  in_RDI;
  Float v;
  const_iterator iter;
  ParsedParameter *p;
  const_iterator __end1;
  const_iterator __begin1;
  ParsedParameterVector *__range1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff78;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_stack_ffffffffffffff80;
  float *in_stack_ffffffffffffff88;
  TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatDirectionMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::GPUFloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
  this_00;
  _Self in_stack_ffffffffffffffb0;
  _Self in_stack_ffffffffffffffb8;
  ParsedParameter *args;
  
  this_00.bits = in_RDI.bits;
  loc = (FileLoc *)
        InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
        ::begin((InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                 *)*in_RSI);
  fmt = (FileLoc *)
        InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
        ::end(in_stack_ffffffffffffff80);
  do {
    if (loc == fmt) {
      FloatTexture::TaggedPointer
                ((FloatTexture *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      return (FloatTexture)
             (TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatDirectionMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::GPUFloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
              )in_RDI.bits;
    }
    args = (ParsedParameter *)(loc->filename)._M_len;
    bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    if (!bVar1) {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_ffffffffffffff80,(char *)in_stack_ffffffffffffff78);
      if (bVar1) {
        bVar1 = pstd::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)0x745bf1);
        if (bVar1) {
          ErrorExit<std::__cxx11::string_const&>
                    ((FileLoc *)args,(char *)in_stack_ffffffffffffffb8._M_node,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffffb0._M_node);
        }
        sVar2 = pstd::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(&args->strings);
        if (sVar2 == 1) {
          args->lookedUp = true;
          pstd::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[](&args->strings,0);
          args_1 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::FloatTexture,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::FloatTexture>_>_>
                   ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::FloatTexture,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::FloatTexture>_>_>
                           *)in_stack_ffffffffffffff78,(key_type *)0x745c7e);
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::FloatTexture,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::FloatTexture>_>_>
          ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::FloatTexture,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::FloatTexture>_>_>
                 *)in_stack_ffffffffffffff78);
          bVar1 = std::operator!=((_Self *)&stack0xffffffffffffffb8,
                                  (_Self *)&stack0xffffffffffffffb0);
          if (bVar1) {
            std::
            _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::FloatTexture>_>
            ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::FloatTexture>_>
                          *)0x745cb8);
            FloatTexture::FloatTexture
                      ((FloatTexture *)in_stack_ffffffffffffff80,
                       (FloatTexture *)in_stack_ffffffffffffff78);
            return (FloatTexture)
                   (TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatDirectionMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::GPUFloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
                    )in_RDI.bits;
          }
          pstd::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[](&args->strings,0);
          ErrorExit<std::__cxx11::string_const&,std::__cxx11::string_const&>
                    (loc,(char *)fmt,&args->type,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     args_1._M_node);
        }
        ErrorExit<std::__cxx11::string_const&>
                  ((FileLoc *)args,(char *)in_stack_ffffffffffffffb8._M_node,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffffb0._M_node);
      }
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_ffffffffffffff80,(char *)in_stack_ffffffffffffff78);
      if (bVar1) {
        GetOneFloat((TextureParameterDictionary *)in_stack_ffffffffffffff80,
                    in_stack_ffffffffffffff78,0.0);
        pstd::pmr::polymorphic_allocator<std::byte>::new_object<pbrt::FloatConstantTexture,float&>
                  ((polymorphic_allocator<std::byte> *)this_00.bits,in_stack_ffffffffffffff88);
        FloatTexture::TaggedPointer<pbrt::FloatConstantTexture>
                  ((FloatTexture *)in_stack_ffffffffffffff80,
                   (FloatConstantTexture *)in_stack_ffffffffffffff78);
        return (FloatTexture)
               (TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatDirectionMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::GPUFloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
                )in_RDI.bits;
      }
    }
    loc = (FileLoc *)&(loc->filename)._M_str;
  } while( true );
}

Assistant:

FloatTexture TextureParameterDictionary::GetFloatTextureOrNull(const std::string &name,
                                                               Allocator alloc) const {
    for (const ParsedParameter *p : dict->params) {
        if (p->name != name)
            continue;

        if (p->type == "texture") {
            if (p->strings.empty())
                ErrorExit(&p->loc, "No texture name provided for parameter \"%s\".",
                          name);
            if (p->strings.size() != 1)
                ErrorExit(&p->loc,
                          "More than one texture name provided for parameter \"%s\".",
                          name);

            p->lookedUp = true;
            auto iter = textures->floatTextures.find(p->strings[0]);
            if (iter != textures->floatTextures.end())
                return iter->second;

            ErrorExit(&p->loc,
                      R"(Couldn't find float texture named "%s" for parameter "%s")",
                      p->strings[0], p->name);
        } else if (p->type == "float") {
            Float v = GetOneFloat(name, 0.f);  // we know this will be found
            return alloc.new_object<FloatConstantTexture>(v);
        }
    }

    return nullptr;
}